

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arbiter.cpp
# Opt level: O1

int __thiscall arbiter::Arbiter::copy(Arbiter *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  pointer pcVar1;
  int iVar2;
  int extraout_EAX;
  char *extraout_RAX;
  char *extraout_RAX_00;
  char *extraout_RAX_01;
  char *pcVar3;
  ostream *poVar4;
  runtime_error *prVar5;
  bool in_CL;
  pointer pbVar6;
  bool bVar7;
  string subpath;
  string srcToResolve;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  paths;
  Endpoint dstEndpoint;
  string commonPrefix;
  string local_2d8;
  undefined1 *local_2b8;
  long local_2b0;
  undefined1 local_2a8 [16];
  string local_298;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_278;
  string local_260;
  undefined1 local_240 [24];
  char local_228 [16];
  string local_218;
  string local_1f8;
  undefined1 *local_1d8;
  long local_1d0;
  undefined1 local_1c8 [16];
  string local_1b8;
  string local_198;
  string local_178;
  string local_158;
  string local_138;
  string local_118;
  undefined1 *local_f8 [2];
  undefined1 local_e8 [16];
  Endpoint local_d8;
  string local_b0;
  string local_90;
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  if (*(long *)(dst + 8) == 0) {
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_50[0] = local_40;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_50,"Cannot copy from empty source","");
    ::std::runtime_error::runtime_error(prVar5,(string *)local_50);
    *(undefined ***)prVar5 = &PTR__runtime_error_001940e8;
    __cxa_throw(prVar5,&ArbiterError::typeinfo,::std::runtime_error::~runtime_error);
  }
  if (*(long *)(src + 8) == 0) {
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_70[0] = local_60;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_70,"Cannot copy to empty destination","");
    ::std::runtime_error::runtime_error(prVar5,(string *)local_70);
    *(undefined ***)prVar5 = &PTR__runtime_error_001940e8;
    __cxa_throw(prVar5,&ArbiterError::typeinfo,::std::runtime_error::~runtime_error);
  }
  local_1d8 = local_1c8;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1d8,*(long *)dst,*(long *)(dst + 8) + *(long *)dst);
  if (local_1d0 == 0) {
LAB_00131e1e:
    local_240._0_8_ = local_240 + 0x10;
    ::std::__cxx11::string::_M_construct<char*>((string *)local_240,local_1d8,local_1d8 + local_1d0)
    ;
    bVar7 = true;
  }
  else {
    bVar7 = false;
    if ((local_1d8[local_1d0 + -1] != '/') && (local_1d8[local_1d0 + -1] != '\\'))
    goto LAB_00131e1e;
  }
  if ((bVar7) && ((Driver *)local_240._0_8_ != (Driver *)(local_240 + 0x10))) {
    operator_delete((void *)local_240._0_8_);
  }
  local_2b8 = local_2a8;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_2b8,*(long *)dst,*(long *)(dst + 8) + *(long *)dst);
  ::std::__cxx11::string::append((char *)&local_2b8);
  if (local_1d8 != local_1c8) {
    operator_delete(local_1d8);
  }
  if (local_2b8[local_2b0 + -1] == '*') {
    local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_158,*(long *)dst,*(long *)(dst + 8) + *(long *)dst);
    stripPostfixing(&local_90,&local_158);
    getEndpoint((Endpoint *)local_240,this,&local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_dataplus._M_p != &local_158.field_2) {
      operator_delete(local_158._M_dataplus._M_p);
    }
    Endpoint::prefixedRoot_abi_cxx11_(&local_b0,(Endpoint *)local_240);
    local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_178,*(long *)src,*(long *)(src + 8) + *(long *)src);
    getEndpoint(&local_d8,this,&local_178);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_178._M_dataplus._M_p != &local_178.field_2) {
      operator_delete(local_178._M_dataplus._M_p);
    }
    Endpoint::prefixedRoot_abi_cxx11_(&local_2d8,(Endpoint *)local_240);
    Endpoint::prefixedRoot_abi_cxx11_(&local_298,&local_d8);
    if (local_2d8._M_string_length == local_298._M_string_length) {
      if (local_2d8._M_string_length == 0) {
        bVar7 = true;
      }
      else {
        iVar2 = bcmp(local_2d8._M_dataplus._M_p,local_298._M_dataplus._M_p,
                     local_2d8._M_string_length);
        bVar7 = iVar2 == 0;
      }
    }
    else {
      bVar7 = false;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_298._M_dataplus._M_p != &local_298.field_2) {
      operator_delete(local_298._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
      operator_delete(local_2d8._M_dataplus._M_p);
    }
    if (bVar7) {
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_f8[0] = local_e8;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_f8,"Cannot copy directory to itself","");
      ::std::runtime_error::runtime_error(prVar5,(string *)local_f8);
      *(undefined ***)prVar5 = &PTR__runtime_error_001940e8;
      __cxa_throw(prVar5,&ArbiterError::typeinfo,::std::runtime_error::~runtime_error);
    }
    local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_198,local_2b8,local_2b8 + local_2b0);
    resolve(&local_278,this,&local_198,in_CL);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198._M_dataplus._M_p != &local_198.field_2) {
      operator_delete(local_198._M_dataplus._M_p);
    }
    if (local_278.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_278.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      iVar2 = 0;
      pbVar6 = local_278.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      do {
        ::std::__cxx11::string::substr((ulong)&local_2d8,(ulong)pbVar6);
        if (in_CL != false) {
          iVar2 = iVar2 + 1;
          poVar4 = (ostream *)::std::ostream::operator<<((ostream *)&::std::cout,iVar2);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar4," / ",3);
          poVar4 = ::std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar4,": ",2);
          poVar4 = ::std::__ostream_insert<char,std::char_traits<char>>
                             (poVar4,(pbVar6->_M_dataplus)._M_p,pbVar6->_M_string_length);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar4," -> ",4);
          Endpoint::prefixedFullPath(&local_298,&local_d8,&local_2d8);
          poVar4 = ::std::__ostream_insert<char,std::char_traits<char>>
                             (poVar4,local_298._M_dataplus._M_p,local_298._M_string_length);
          ::std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
          ::std::ostream::put((char)poVar4);
          ::std::ostream::flush();
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_298._M_dataplus._M_p != &local_298.field_2) {
            operator_delete(local_298._M_dataplus._M_p);
          }
        }
        bVar7 = Endpoint::isLocal(&local_d8);
        if (bVar7) {
          Endpoint::fullPath(&local_1f8,&local_d8,&local_2d8);
          getDirname(&local_1b8,&local_1f8);
          mkdirp(&local_1b8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
            operator_delete(local_1b8._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
            operator_delete(local_1f8._M_dataplus._M_p);
          }
        }
        local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_260,local_2d8._M_dataplus._M_p,
                   local_2d8._M_dataplus._M_p + local_2d8._M_string_length);
        local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
        pcVar1 = (pbVar6->_M_dataplus)._M_p;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_218,pcVar1,pcVar1 + pbVar6->_M_string_length);
        getBinary((vector<char,_std::allocator<char>_> *)&local_298,this,&local_218);
        Endpoint::put(&local_d8,&local_260,(vector<char,_std::allocator<char>_> *)&local_298);
        if (local_298._M_dataplus._M_p != (char *)0x0) {
          operator_delete(local_298._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_218._M_dataplus._M_p != &local_218.field_2) {
          operator_delete(local_218._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_260._M_dataplus._M_p != &local_260.field_2) {
          operator_delete(local_260._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
          operator_delete(local_2d8._M_dataplus._M_p);
        }
        pbVar6 = pbVar6 + 1;
      } while (pbVar6 != local_278.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
    }
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_278);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8.m_root._M_dataplus._M_p != &local_d8.m_root.field_2) {
      operator_delete(local_d8.m_root._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
    pcVar3 = local_228;
    if ((char *)local_240._8_8_ == pcVar3) goto LAB_001320a1;
  }
  else {
    local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_118,*(long *)dst,*(long *)(dst + 8) + *(long *)dst);
    local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_138,*(long *)src,*(long *)(src + 8) + *(long *)src);
    copyFile(this,&local_118,&local_138,in_CL);
    pcVar3 = extraout_RAX;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_dataplus._M_p != &local_138.field_2) {
      operator_delete(local_138._M_dataplus._M_p);
      pcVar3 = extraout_RAX_00;
    }
    local_240._8_8_ = local_118._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p == &local_118.field_2) goto LAB_001320a1;
  }
  operator_delete((void *)local_240._8_8_);
  pcVar3 = extraout_RAX_01;
LAB_001320a1:
  iVar2 = (int)pcVar3;
  if (local_2b8 != local_2a8) {
    operator_delete(local_2b8);
    iVar2 = extraout_EAX;
  }
  return iVar2;
}

Assistant:

void Arbiter::copy(
        const std::string src,
        const std::string dst,
        const bool verbose) const
{
    if (src.empty()) throw ArbiterError("Cannot copy from empty source");
    if (dst.empty()) throw ArbiterError("Cannot copy to empty destination");

    // Globify the source path if it's a directory.  In this case, the source
    // already ends with a slash.
    const std::string srcToResolve(src + (isDirectory(src) ? "**" : ""));

    if (srcToResolve.back() != '*')
    {
        // The source is a single file.
        copyFile(src, dst, verbose);
    }
    else
    {
        // We'll need this to mirror the directory structure in the output.
        // All resolved paths will contain this common prefix, so we can
        // determine any nested paths from recursive resolutions by stripping
        // that common portion.
        const Endpoint& srcEndpoint(getEndpoint(stripPostfixing(src)));
        const std::string commonPrefix(srcEndpoint.prefixedRoot());

        const Endpoint dstEndpoint(getEndpoint(dst));

        if (srcEndpoint.prefixedRoot() == dstEndpoint.prefixedRoot())
        {
            throw ArbiterError("Cannot copy directory to itself");
        }

        int i(0);
        const auto paths(resolve(srcToResolve, verbose));

        for (const auto& path : paths)
        {
            const std::string subpath(path.substr(commonPrefix.size()));

            if (verbose)
            {
                std::cout <<
                    ++i << " / " << paths.size() << ": " <<
                    path << " -> " << dstEndpoint.prefixedFullPath(subpath) <<
                    std::endl;
            }

            if (dstEndpoint.isLocal())
            {
                mkdirp(getDirname(dstEndpoint.fullPath(subpath)));
            }

            dstEndpoint.put(subpath, getBinary(path));
        }
    }
}